

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

bool __thiscall argo::json::operator<=(json *this,json *other)

{
  type tVar1;
  type tVar2;
  pointer pcVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  string *psVar7;
  ulong uVar8;
  json_exception *this_00;
  char *first_json_type_name;
  char *second_json_type_name;
  bool bVar9;
  double dVar10;
  double dVar11;
  undefined1 *local_68;
  ulong local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  ulong local_40;
  undefined1 local_38 [16];
  
  tVar1 = this->m_type;
  tVar2 = other->m_type;
  if (tVar2 == string_e && tVar1 == string_e) {
    psVar7 = operator_cast_to_string_(this);
    pcVar3 = (psVar7->_M_dataplus)._M_p;
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar3,pcVar3 + psVar7->_M_string_length);
    psVar7 = operator_cast_to_string_(other);
    pcVar3 = (psVar7->_M_dataplus)._M_p;
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar3,pcVar3 + psVar7->_M_string_length);
    uVar8 = local_60;
    if (local_40 < local_60) {
      uVar8 = local_40;
    }
    if (uVar8 == 0) {
      uVar8 = 0;
    }
    else {
      uVar4 = memcmp(local_68,local_48,uVar8);
      uVar8 = (ulong)uVar4;
    }
    if ((int)uVar8 == 0) {
      uVar8 = 0xffffffff80000000;
      if (-0x80000000 < (long)(local_60 - local_40)) {
        uVar8 = local_60 - local_40;
      }
      if (0x7ffffffe < (long)uVar8) {
        uVar8 = 0x7fffffff;
      }
    }
    bVar9 = (int)uVar8 < 1;
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
    if (local_68 != local_58) {
      operator_delete(local_68);
    }
  }
  else if (tVar2 == number_int_e && (tVar1 ^ number_int_e) == object_e) {
    iVar5 = operator_cast_to_int(this);
    iVar6 = operator_cast_to_int(other);
    bVar9 = iVar5 <= iVar6;
  }
  else {
    if (((tVar2 & ~array_e) != number_int_e || tVar1 != number_double_e) &&
       ((tVar1 ^ number_int_e) != object_e || tVar2 != number_double_e)) {
      this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
      first_json_type_name = get_instance_type_name(this);
      second_json_type_name = get_instance_type_name(other);
      json_exception::json_exception
                (this_00,types_not_comparable_e,first_json_type_name,second_json_type_name);
      __cxa_throw(this_00,&json_exception::typeinfo,std::exception::~exception);
    }
    dVar10 = operator_cast_to_double(this);
    dVar11 = operator_cast_to_double(other);
    bVar9 = dVar10 <= dVar11;
  }
  return bVar9;
}

Assistant:

bool json::operator<=(const json &other) const
{
    if (m_type == string_e && other.m_type == string_e)
    {
        return static_cast<string>(*this) <= static_cast<string>(other);
    }
    else if (m_type == number_int_e && other.m_type == number_int_e)
    {
        return static_cast<int>(*this) <= static_cast<int>(other);
    }
    else if ((m_type == number_double_e && other.m_type == number_double_e) ||
             (m_type == number_double_e && other.m_type == number_int_e) ||
             (m_type == number_int_e && other.m_type == number_double_e))
    {
        return static_cast<double>(*this) <= static_cast<double>(other);
    }
    else
    {
        throw json_exception(
                        json_exception::types_not_comparable_e,
                        get_instance_type_name(),
                        other.get_instance_type_name());
    }
}